

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptContext.h
# Opt level: O2

void __thiscall SRCINFO::SRCINFO(SRCINFO *this,SRCINFO *other)

{
  Type TVar1;
  Type TVar2;
  Type TVar3;
  
  Memory::WriteBarrierPtr<SourceContextInfo>::WriteBarrierSet
            (&this->sourceContextInfo,(other->sourceContextInfo).ptr);
  TVar1 = other->ulColumnHost;
  TVar2 = other->lnMinHost;
  TVar3 = other->ichMinHost;
  this->dlnHost = other->dlnHost;
  this->ulColumnHost = TVar1;
  this->lnMinHost = TVar2;
  this->ichMinHost = TVar3;
  TVar1 = other->ulCharOffset;
  TVar2 = other->moduleID;
  TVar3 = other->grfsi;
  this->ichLimHost = other->ichLimHost;
  this->ulCharOffset = TVar1;
  this->moduleID = TVar2;
  this->grfsi = TVar3;
  return;
}

Assistant:

SRCINFO(const SRCINFO& other)
        :sourceContextInfo(other.sourceContextInfo),
        dlnHost(other.dlnHost),
        ulColumnHost(other.ulColumnHost),
        lnMinHost(other.lnMinHost),
        ichMinHost(other.ichMinHost),
        ichLimHost(other.ichLimHost),
        ulCharOffset(other.ulCharOffset),
        moduleID(other.moduleID),
        grfsi(other.grfsi)
    {
    }